

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignedsuperblockheap.h
# Opt level: O0

void * __thiscall
Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>::malloc
          (SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource> *this,size_t __size)

{
  bool bVar1;
  void *pvVar2;
  Entry *pEVar3;
  int i;
  char *p;
  void *ptr;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  
  bVar1 = HL::DLList::isEmpty((DLList *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    pvVar2 = HL::
             ExactlyOneHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::AlignedMmapInstance<262144UL>_>_>
             ::malloc((ExactlyOneHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::AlignedMmapInstance<262144UL>_>_>
                       *)this,0x40000);
    if (pvVar2 == (void *)0x0) {
      return (void *)0x0;
    }
    for (iVar4 = 0; iVar4 < 1; iVar4 = iVar4 + 1) {
      HL::DLList::insert((DLList *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),(Entry *)this);
    }
  }
  pEVar3 = HL::DLList::get((DLList *)&((Entry *)this)->next);
  return pEVar3;
}

Assistant:

void * malloc (size_t) {
      if (_freeSuperblocks.isEmpty()) {
	// Get more memory.
	void * ptr = _superblockSource.malloc (ChunksToGrab * SuperblockSize);
	if (!ptr) {
	  return nullptr;
	}
	char * p = (char *) ptr;
	for (int i = 0; i < ChunksToGrab; i++) {
	  _freeSuperblocks.insert ((DLList::Entry *) p);
	  p += SuperblockSize;
	}
      }
      return _freeSuperblocks.get();
    }